

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

_Bool is_event_equal(IOTHUB_EVENT_CALLBACK *event_callback,char *input_name)

{
  int iVar1;
  char *__s1;
  char *event_input_name;
  _Bool result;
  char *input_name_local;
  IOTHUB_EVENT_CALLBACK *event_callback_local;
  
  if (event_callback == (IOTHUB_EVENT_CALLBACK *)0x0) {
    event_input_name._7_1_ = false;
  }
  else {
    __s1 = STRING_c_str(event_callback->inputName);
    if ((__s1 == (char *)0x0) || (input_name == (char *)0x0)) {
      if ((input_name == (char *)0x0) && (__s1 == (char *)0x0)) {
        event_input_name._7_1_ = true;
      }
      else {
        event_input_name._7_1_ = false;
      }
    }
    else {
      iVar1 = strcmp(__s1,input_name);
      event_input_name._7_1_ = iVar1 == 0;
    }
  }
  return event_input_name._7_1_;
}

Assistant:

static bool is_event_equal(IOTHUB_EVENT_CALLBACK *event_callback, const char *input_name)
{
    bool result;

    if (event_callback != NULL)
    {
        const char* event_input_name = STRING_c_str(event_callback->inputName);
        if ((event_input_name != NULL) && (input_name != NULL))
        {
            // Matched the input queue name of a named handler
            result = (strcmp(event_input_name, input_name) == 0);
        }
        else if ((input_name == NULL) && (event_input_name == NULL))
        {
            // Matched the default handler
            result = true;
        }
        else
        {
            result = false;
        }
    }
    else
    {
        result = false;
    }
    return result;
}